

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

DirectionCone * __thiscall
pbrt::Disk::NormalBounds(DirectionCone *__return_storage_ptr__,Disk *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  Transform *pTVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  pTVar4 = this->renderFromObject;
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)((pTVar4->mInv).m[1][2] * 0.0)),ZEXT816(0) << 0x40,
                            ZEXT416((uint)(pTVar4->mInv).m[0][2]));
  fVar6 = auVar10._0_4_ + (pTVar4->mInv).m[2][2];
  bVar3 = this->reverseOrientation;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(pTVar4->mInv).m[0];
  uVar1 = *(undefined8 *)(pTVar4->mInv).m[1];
  uVar2 = *(undefined8 *)(pTVar4->mInv).m[2];
  auVar11._0_4_ = (float)uVar1 * 0.0;
  auVar11._4_4_ = (float)((ulong)uVar1 >> 0x20) * 0.0;
  auVar11._8_8_ = 0;
  auVar10 = vfmadd231ps_fma(auVar11,ZEXT816(0) << 0x20,auVar10);
  auVar12._0_4_ = (float)uVar2 + auVar10._0_4_;
  auVar12._4_4_ = (float)((ulong)uVar2 >> 0x20) + auVar10._4_4_;
  auVar12._8_4_ = auVar10._8_4_ + 0.0;
  auVar12._12_4_ = auVar10._12_4_ + 0.0;
  if (bVar3 != false) {
    uVar5 = CONCAT44(auVar12._4_4_,auVar12._0_4_);
    auVar12._0_8_ = uVar5 ^ 0x8000000080000000;
    auVar12._8_4_ = -auVar12._8_4_;
    auVar12._12_4_ = -auVar12._12_4_;
  }
  fVar6 = (float)((uint)(bVar3 & 1) * (int)-fVar6 + (uint)!(bool)(bVar3 & 1) * (int)fVar6);
  auVar8._0_4_ = auVar12._0_4_ * auVar12._0_4_;
  auVar8._4_4_ = auVar12._4_4_ * auVar12._4_4_;
  auVar8._8_4_ = auVar12._8_4_ * auVar12._8_4_;
  auVar8._12_4_ = auVar12._12_4_ * auVar12._12_4_;
  auVar10 = vmovshdup_avx(auVar8);
  auVar10 = vfmadd231ss_fma(auVar10,auVar12,auVar12);
  auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar6),ZEXT416((uint)fVar6));
  if (auVar10._0_4_ < 0.0) {
    fVar7 = sqrtf(auVar10._0_4_);
  }
  else {
    auVar10 = vsqrtss_avx(auVar10,auVar10);
    fVar7 = auVar10._0_4_;
  }
  auVar9._4_4_ = fVar7;
  auVar9._0_4_ = fVar7;
  auVar9._8_4_ = fVar7;
  auVar9._12_4_ = fVar7;
  auVar10 = vdivps_avx(auVar12,auVar9);
  uVar1 = vmovlps_avx(auVar10);
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z = fVar6 / fVar7;
  __return_storage_ptr__->cosTheta = 1.0;
  __return_storage_ptr__->empty = false;
  return __return_storage_ptr__;
}

Assistant:

DirectionCone Disk::NormalBounds() const {
    Normal3f n = (*renderFromObject)(Normal3f(0, 0, 1));
    if (reverseOrientation)
        n = -n;
    return DirectionCone(Vector3f(n));
}